

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spin_lock.h
# Opt level: O2

void __thiscall
cornelich::util::spin_lock::lock<cornelich::util::default_backoff<5ul>>
          (spin_lock *this,default_backoff<5UL> backoff)

{
  __atomic_flag_data_type _Var1;
  default_backoff<5UL> local_18;
  
  local_18.m_count = backoff.m_count;
  while( true ) {
    LOCK();
    _Var1 = (this->m_flag).super___atomic_flag_base._M_i;
    (this->m_flag).super___atomic_flag_base._M_i = true;
    UNLOCK();
    if (_Var1 == false) break;
    default_backoff<5UL>::operator()(&local_18);
  }
  return;
}

Assistant:

void lock(backoff_t backoff) noexcept
    {
        while(BOOST_UNLIKELY(m_flag.test_and_set(std::memory_order_acquire)))
            backoff();
    }